

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O2

uint Js::JavascriptArray::GetFromIndex<unsigned_int>
               (Var arg,uint length,ScriptContext *scriptContext,bool addWithLength)

{
  bool bVar1;
  uint uVar2;
  int64 iVar3;
  long lVar4;
  double dVar5;
  
  bVar1 = TaggedInt::Is(arg);
  if (bVar1) {
    iVar3 = TaggedInt::ToInt64(arg);
    dVar5 = (double)iVar3;
  }
  else {
    dVar5 = JavascriptConversion::ToInteger(arg,scriptContext);
  }
  if (0.0 <= dVar5) {
    if ((double)length <= dVar5) {
      dVar5 = (double)length;
    }
    uVar2 = (uint)(long)dVar5;
  }
  else {
    uVar2 = 0;
    if (addWithLength) {
      lVar4 = 0;
      if (0 < (long)(dVar5 + (double)length)) {
        lVar4 = (long)(dVar5 + (double)length);
      }
      uVar2 = (uint)lVar4;
    }
  }
  return uVar2;
}

Assistant:

static T GetFromIndex(Var arg, T length, ScriptContext *scriptContext, bool addWithLength = true)
        {
            T fromIndex = 0;

            double value = TaggedInt::Is(arg) ? (double)TaggedInt::ToInt64(arg) : JavascriptConversion::ToInteger(arg, scriptContext);

            if (value < 0)
            {
                fromIndex = addWithLength ? (T)max(0i64, (int64)(value + length)) : 0;
            }
            else
            {
                fromIndex = (T)min(value, (double)length);
            }
            return fromIndex;
        }